

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O2

void RandAddDynamicEnv(CSHA512 *hasher)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  void **local_e8;
  void *addr;
  rusage usage;
  timeval tv;
  timespec ts;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ts.tv_sec = 0;
  ts.tv_nsec = 0;
  clock_gettime(1,(timespec *)&ts);
  (anonymous_namespace)::operator<<(hasher,&ts);
  clock_gettime(0,(timespec *)&ts);
  (anonymous_namespace)::operator<<(hasher,&ts);
  clock_gettime(7,(timespec *)&ts);
  (anonymous_namespace)::operator<<(hasher,&ts);
  tv.tv_sec = 0;
  tv.tv_usec = 0;
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  CSHA512::Write(hasher,(uchar *)&tv,0x10);
  usage.ru_utime.tv_sec = std::chrono::_V2::system_clock::now();
  (anonymous_namespace)::operator<<(hasher,(long *)&usage);
  usage.ru_utime.tv_sec = std::chrono::_V2::steady_clock::now();
  (anonymous_namespace)::operator<<(hasher,(long *)&usage);
  usage.ru_utime.tv_sec = std::chrono::_V2::system_clock::now();
  (anonymous_namespace)::operator<<(hasher,(long *)&usage);
  memset(&usage,0,0x90);
  iVar2 = getrusage(RUSAGE_SELF,(rusage *)&usage);
  if (iVar2 == 0) {
    CSHA512::Write(hasher,(uchar *)&usage,0x90);
  }
  anon_unknown.dwarf_230bb46::AddFile(hasher,"/proc/diskstats");
  anon_unknown.dwarf_230bb46::AddFile(hasher,"/proc/vmstat");
  anon_unknown.dwarf_230bb46::AddFile(hasher,"/proc/schedstat");
  anon_unknown.dwarf_230bb46::AddFile(hasher,"/proc/zoneinfo");
  anon_unknown.dwarf_230bb46::AddFile(hasher,"/proc/meminfo");
  anon_unknown.dwarf_230bb46::AddFile(hasher,"/proc/softirqs");
  anon_unknown.dwarf_230bb46::AddFile(hasher,"/proc/stat");
  anon_unknown.dwarf_230bb46::AddFile(hasher,"/proc/self/schedstat");
  anon_unknown.dwarf_230bb46::AddFile(hasher,"/proc/self/status");
  addr = malloc(0x1001);
  local_e8 = &addr;
  CSHA512::Write(hasher,(uchar *)&local_e8,8);
  CSHA512::Write(hasher,(uchar *)&addr,8);
  free(addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RandAddDynamicEnv(CSHA512& hasher)
{
    RandAddSeedPerfmon(hasher);

    // Various clocks
#ifdef WIN32
    FILETIME ftime;
    GetSystemTimeAsFileTime(&ftime);
    hasher << ftime;
#else
    struct timespec ts = {};
#    ifdef CLOCK_MONOTONIC
    clock_gettime(CLOCK_MONOTONIC, &ts);
    hasher << ts;
#    endif
#    ifdef CLOCK_REALTIME
    clock_gettime(CLOCK_REALTIME, &ts);
    hasher << ts;
#    endif
#    ifdef CLOCK_BOOTTIME
    clock_gettime(CLOCK_BOOTTIME, &ts);
    hasher << ts;
#    endif
    // gettimeofday is available on all UNIX systems, but only has microsecond precision.
    struct timeval tv = {};
    gettimeofday(&tv, nullptr);
    hasher << tv;
#endif
    // Probably redundant, but also use all the standard library clocks:
    hasher << std::chrono::system_clock::now().time_since_epoch().count();
    hasher << std::chrono::steady_clock::now().time_since_epoch().count();
    hasher << std::chrono::high_resolution_clock::now().time_since_epoch().count();

#ifndef WIN32
    // Current resource usage.
    struct rusage usage = {};
    if (getrusage(RUSAGE_SELF, &usage) == 0) hasher << usage;
#endif

#ifdef __linux__
    AddFile(hasher, "/proc/diskstats");
    AddFile(hasher, "/proc/vmstat");
    AddFile(hasher, "/proc/schedstat");
    AddFile(hasher, "/proc/zoneinfo");
    AddFile(hasher, "/proc/meminfo");
    AddFile(hasher, "/proc/softirqs");
    AddFile(hasher, "/proc/stat");
    AddFile(hasher, "/proc/self/schedstat");
    AddFile(hasher, "/proc/self/status");
#endif

#ifdef HAVE_SYSCTL
#  ifdef CTL_KERN
#    if defined(KERN_PROC) && defined(KERN_PROC_ALL)
    AddSysctl<CTL_KERN, KERN_PROC, KERN_PROC_ALL>(hasher);
#    endif
#  endif
#  ifdef CTL_HW
#    ifdef HW_DISKSTATS
    AddSysctl<CTL_HW, HW_DISKSTATS>(hasher);
#    endif
#  endif
#  ifdef CTL_VM
#    ifdef VM_LOADAVG
    AddSysctl<CTL_VM, VM_LOADAVG>(hasher);
#    endif
#    ifdef VM_TOTAL
    AddSysctl<CTL_VM, VM_TOTAL>(hasher);
#    endif
#    ifdef VM_METER
    AddSysctl<CTL_VM, VM_METER>(hasher);
#    endif
#  endif
#endif

    // Stack and heap location
    void* addr = malloc(4097);
    hasher << &addr << addr;
    free(addr);
}